

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::AvxHBDObmcSubpelVarianceTest_Ref_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::AvxHBDObmcSubpelVarianceTest_Ref_Test>
           *this)

{
  ObmcVarianceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>
  *this_00;
  
  WithParamInterface<(anonymous_namespace)::TestParams<unsigned_int(*)(unsigned_char_const*,int,int,int,int_const*,int_const*,unsigned_int*)>>
  ::parameter_ = &this->parameter_;
  this_00 = (ObmcVarianceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>
             *)operator_new(0x68);
  anon_unknown.dwarf_1d6630d::
  ObmcVarianceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>
  ::ObmcVarianceTest(this_00);
  (this_00->
  super_TestWithParam<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_00f6a5e0;
  (this_00->
  super_TestWithParam<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>
  ).
  super_WithParamInterface<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__AvxHBDObmcSubpelVarianceTest_Ref_Test_00f6a620;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }